

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::lazyPrintGroupInfo(ConsoleReporter *this)

{
  ulong uVar1;
  GroupInfo *pGVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  ConsoleReporter *local_10;
  ConsoleReporter *this_local;
  
  local_10 = this;
  Option<Catch::GroupInfo>::operator->
            (&(this->super_StreamingReporterBase<Catch::ConsoleReporter>).currentGroupInfo.
              super_Option<Catch::GroupInfo>);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    pGVar2 = Option<Catch::GroupInfo>::operator->
                       (&(this->super_StreamingReporterBase<Catch::ConsoleReporter>).
                         currentGroupInfo.super_Option<Catch::GroupInfo>);
    if (1 < pGVar2->groupsCounts) {
      pGVar2 = Option<Catch::GroupInfo>::operator->
                         (&(this->super_StreamingReporterBase<Catch::ConsoleReporter>).
                           currentGroupInfo.super_Option<Catch::GroupInfo>);
      std::operator+(&local_30,"Group: ",&pGVar2->name);
      printClosedHeader(this,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      (this->super_StreamingReporterBase<Catch::ConsoleReporter>).currentGroupInfo.used = true;
    }
  }
  return;
}

Assistant:

void ConsoleReporter::lazyPrintGroupInfo() {
    if (!currentGroupInfo->name.empty() && currentGroupInfo->groupsCounts > 1) {
        printClosedHeader("Group: " + currentGroupInfo->name);
        currentGroupInfo.used = true;
    }
}